

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O3

char * light_pcapng_to_string(light_pcapng pcapng)

{
  _light_pcapng **pp_Var1;
  light_pcapng iterator;
  _light_pcapng *p_Var2;
  char *pcVar3;
  char *__s;
  _light_option *p_Var4;
  size_t __n;
  uint uVar5;
  ulong uVar6;
  char *__dest;
  
  pcVar3 = (char *)0x0;
  p_Var2 = pcapng;
  if (pcapng != (light_pcapng)0x0) {
    do {
      pp_Var1 = &p_Var2->next_block;
      uVar5 = (int)pcVar3 + 0x80;
      pcVar3 = (char *)(ulong)uVar5;
      p_Var2 = *pp_Var1;
    } while (*pp_Var1 != (_light_pcapng *)0x0);
    pcVar3 = (char *)calloc((ulong)uVar5,1);
    __dest = pcVar3;
    if (pcVar3 == (char *)0x0) {
      light_pcapng_to_string_cold_1();
      pcVar3 = (char *)0x0;
    }
    else {
      do {
        __s = (char *)calloc(0x80,1);
        p_Var4 = pcapng->options;
        uVar6 = 0;
        if (p_Var4 != (_light_option *)0x0) {
          uVar6 = 0;
          do {
            p_Var4 = p_Var4->next_option;
            uVar6 = (ulong)((int)uVar6 + 1);
          } while (p_Var4 != (_light_option *)0x0);
        }
        sprintf(__s,"---\nType = 0x%X\nLength = %u\nData Pointer = %p\nOption count = %d\n---\n",
                (ulong)pcapng->block_type,(ulong)pcapng->block_total_lenght,pcapng->block_body,uVar6
               );
        __n = strlen(__s);
        memcpy(__dest,__s,__n);
        free(__s);
        pcapng = pcapng->next_block;
        __dest = __dest + __n;
      } while (pcapng != (_light_pcapng *)0x0);
    }
  }
  return pcVar3;
}

Assistant:

char *light_pcapng_to_string(light_pcapng pcapng)
{
	if (pcapng == NULL)
		return NULL;

	light_pcapng iter = pcapng;
	uint32_t block_count = light_get_block_count(pcapng);
	size_t buffer_size = 128 * block_count;
	char *string = calloc(buffer_size, sizeof(char));
	char *offset = string;
	DCHECK_NULLP(offset, return NULL);

	while (iter != NULL) {
		char *next = calloc(128, 1);

		sprintf(next, "---\nType = 0x%X\nLength = %u\nData Pointer = %p\nOption count = %d\n---\n",
				iter->block_type, iter->block_total_lenght, (void*)iter->block_body, __option_count(iter->options));

		memcpy(offset, next, strlen(next));
		offset += strlen(next);
		free(next);
		iter = iter->next_block;
	}

	return string;
}